

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

ssize_t next_line(archive_read *a,char **b,ssize_t *avail,ssize_t *ravail,ssize_t *nl)

{
  long lVar1;
  byte bVar2;
  void *pvVar3;
  long lVar4;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  ssize_t *in_R8;
  ssize_t tested;
  size_t nbytes_req;
  ssize_t diff;
  int quit;
  ssize_t len;
  size_t in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar5;
  long local_38;
  
  bVar2 = 0;
  if (*in_RDX == 0) {
    *in_R8 = 0;
    local_38 = 0;
    lVar4 = local_38;
  }
  else {
    lVar4 = get_line_size((char *)*in_RSI,*in_RDX,in_R8);
  }
  while( true ) {
    local_38 = lVar4;
    bVar5 = 0;
    if ((*in_R8 == 0) && (bVar5 = 0, local_38 == *in_RDX)) {
      bVar5 = bVar2 ^ 0xff;
    }
    if ((bVar5 & 1) == 0) break;
    lVar4 = *in_RCX;
    lVar1 = *in_RDX;
    pvVar3 = __archive_read_ahead
                       ((archive_read *)CONCAT17(bVar5,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98,(ssize_t *)0x266688);
    *in_RSI = (long)pvVar3;
    if (*in_RSI == 0) {
      if (*in_RDX <= *in_RCX) {
        return 0;
      }
      pvVar3 = __archive_read_ahead
                         ((archive_read *)CONCAT17(bVar5,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98,(ssize_t *)0x2666d5);
      *in_RSI = (long)pvVar3;
      bVar2 = 1;
    }
    *in_RCX = *in_RDX;
    *in_RSI = (lVar4 - lVar1) + *in_RSI;
    *in_RDX = *in_RDX - (lVar4 - lVar1);
    lVar4 = get_line_size((char *)*in_RSI,*in_RDX,in_R8);
    if (-1 < lVar4) {
      lVar4 = local_38 + lVar4;
    }
  }
  return local_38;
}

Assistant:

static ssize_t
next_line(struct archive_read *a,
    const char **b, ssize_t *avail, ssize_t *ravail, ssize_t *nl)
{
	ssize_t len;
	int quit;
	
	quit = 0;
	if (*avail == 0) {
		*nl = 0;
		len = 0;
	} else
		len = get_line_size(*b, *avail, nl);
	/*
	 * Read bytes more while it does not reach the end of line.
	 */
	while (*nl == 0 && len == *avail && !quit) {
		ssize_t diff = *ravail - *avail;
		size_t nbytes_req = (*ravail+1023) & ~1023U;
		ssize_t tested;

		/* Increase reading bytes if it is not enough to at least
		 * new two lines. */
		if (nbytes_req < (size_t)*ravail + 160)
			nbytes_req <<= 1;

		*b = __archive_read_ahead(a, nbytes_req, avail);
		if (*b == NULL) {
			if (*ravail >= *avail)
				return (0);
			/* Reading bytes reaches the end of file. */
			*b = __archive_read_ahead(a, *avail, avail);
			quit = 1;
		}
		*ravail = *avail;
		*b += diff;
		*avail -= diff;
		tested = len;/* Skip some bytes we already determinated. */
		len = get_line_size(*b, *avail, nl);
		if (len >= 0)
			len += tested;
	}
	return (len);
}